

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

bool __thiscall cmGeneratedFileStream::Close(cmGeneratedFileStream *this)

{
  byte bVar1;
  bool bVar2;
  cmGeneratedFileStream *this_local;
  
  bVar1 = std::ios::fail();
  (this->super_ofstream).field_0x159 = (bVar1 ^ 0xff) & 1;
  std::ofstream::close();
  bVar2 = cmGeneratedFileStreamBase::Close
                    ((cmGeneratedFileStreamBase *)
                     &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                      field_0xf8);
  return bVar2;
}

Assistant:

bool cmGeneratedFileStream::Close()
{
  // Save whether the temporary output file is valid before closing.
  this->Okay = !this->fail();

  // Close the temporary output file.
  this->Stream::close(); // NOLINT(cmake-use-cmsys-fstream)

  // Remove the temporary file (possibly by renaming to the real file).
  return this->cmGeneratedFileStreamBase::Close();
}